

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GIC.h
# Opt level: O0

void __thiscall
Gudhi::cover_complex::Cover_complex<std::vector<float,_std::allocator<float>_>_>::
set_cover_from_file(Cover_complex<std::vector<float,_std::allocator<float>_>_> *this,
                   string *cover_file_name)

{
  double dVar1;
  int iVar2;
  mapped_type_conflict1 mVar3;
  bool bVar4;
  _Ios_Openmode _Var5;
  istream *piVar6;
  long *plVar7;
  mapped_type_conflict1 *pmVar8;
  reference pvVar9;
  mapped_type *this_00;
  reference this_01;
  iterator __first;
  size_type sVar10;
  mapped_type *pmVar11;
  key_type local_44c;
  int *piStack_448;
  int i_1;
  int *local_440;
  int *local_438;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_430;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_428;
  iterator it;
  stringstream local_410 [8];
  stringstream stream;
  string local_288 [8];
  string line;
  istream local_258 [8];
  ifstream input;
  undefined1 local_50 [8];
  vector<int,_std::allocator<int>_> cov_number;
  vector<int,_std::allocator<int>_> cov_elts;
  int cov;
  int i;
  string *cover_file_name_local;
  Cover_complex<std::vector<float,_std::allocator<float>_>_> *this_local;
  
  cov_elts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &cov_number.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_50);
  std::ifstream::ifstream(local_258,(string *)cover_file_name,_S_in);
  std::__cxx11::string::string(local_288);
  while( true ) {
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_258,local_288);
    bVar4 = std::ios::operator_cast_to_bool((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
    if (!bVar4) break;
    std::vector<int,_std::allocator<int>_>::clear
              ((vector<int,_std::allocator<int>_> *)
               &cov_number.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    _Var5 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_410,local_288,_Var5);
    while( true ) {
      plVar7 = (long *)std::istream::operator>>
                                 ((istream *)local_410,
                                  (int *)&cov_elts.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar4 = std::ios::operator_cast_to_bool((ios *)((long)plVar7 + *(long *)(*plVar7 + -0x18)));
      if (!bVar4) break;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 &cov_number.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (value_type *)
                 &cov_elts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_50,
                 (value_type *)
                 &cov_elts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      mVar3 = (mapped_type_conflict1)
              cov_elts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage;
      pmVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](&this->cover_fct,
                          (key_type *)
                          &cov_elts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      *pmVar8 = mVar3;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->func_color,
                          (long)cov_elts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._4_4_);
      dVar1 = *pvVar9;
      pmVar11 = std::
                map<int,_std::pair<int,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_double>_>_>_>
                ::operator[](&this->cover_color,
                             (key_type *)
                             &cov_elts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
      pmVar11->second = pmVar11->second + dVar1;
      pmVar11 = std::
                map<int,_std::pair<int,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_double>_>_>_>
                ::operator[](&this->cover_color,
                             (key_type *)
                             &cov_elts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
      pmVar11->first = pmVar11->first + 1;
      this_00 = std::
                map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator[](&this->cover_back,
                             (key_type *)
                             &cov_elts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::push_back
                (this_00,(value_type *)
                         ((long)&cov_elts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage + 4));
    }
    this_01 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[](&this->cover,
                           (long)cov_elts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage._4_4_);
    std::vector<int,_std::allocator<int>_>::operator=
              (this_01,(vector<int,_std::allocator<int>_> *)
                       &cov_number.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    cov_elts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ =
         cov_elts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ + 1;
    std::__cxx11::stringstream::~stringstream(local_410);
  }
  __first = std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)local_50);
  it = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_50);
  std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)it._M_current);
  local_430._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_50);
  local_438 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)local_50);
  local_428 = std::unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                        (local_430,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                         local_438);
  local_440 = (int *)std::vector<int,_std::allocator<int>_>::begin
                               ((vector<int,_std::allocator<int>_> *)local_50);
  piStack_448 = local_428._M_current;
  sVar10 = std::distance<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                     ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_440,
                      local_428);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)local_50,sVar10);
  sVar10 = std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)local_50);
  this->maximal_dim = (int)sVar10 + -1;
  for (local_44c = 0; local_44c <= this->maximal_dim; local_44c = local_44c + 1) {
    pmVar11 = std::
              map<int,_std::pair<int,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_double>_>_>_>
              ::operator[](&this->cover_color,&local_44c);
    iVar2 = pmVar11->first;
    pmVar11 = std::
              map<int,_std::pair<int,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_double>_>_>_>
              ::operator[](&this->cover_color,&local_44c);
    pmVar11->second = pmVar11->second / (double)iVar2;
  }
  std::__cxx11::string::operator=((string *)&this->cover_name,(string *)cover_file_name);
  std::__cxx11::string::~string(local_288);
  std::ifstream::~ifstream(local_258);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &cov_number.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void set_cover_from_file(const std::string& cover_file_name) {
    int i = 0;
    int cov;
    std::vector<int> cov_elts, cov_number;
    std::ifstream input(cover_file_name);
    std::string line;
    while (std::getline(input, line)) {
      cov_elts.clear();
      std::stringstream stream(line);
      while (stream >> cov) {
        cov_elts.push_back(cov);
        cov_number.push_back(cov);
        cover_fct[cov] = cov;
        cover_color[cov].second += func_color[i];
        cover_color[cov].first++;
        cover_back[cov].push_back(i);
      }
      cover[i] = cov_elts;
      i++;
    }

    std::sort(cov_number.begin(), cov_number.end());
    std::vector<int>::iterator it = std::unique(cov_number.begin(), cov_number.end());
    cov_number.resize(std::distance(cov_number.begin(), it));

    maximal_dim = cov_number.size() - 1;
    for (int i = 0; i <= maximal_dim; i++) cover_color[i].second /= cover_color[i].first;
    cover_name = cover_file_name;
  }